

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Mat3x4 * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,10>
          (Mat3x4 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  int inputNdx_local;
  ShaderEvalContext *evalCtx_local;
  Mat3x4 *m;
  
  tcu::Matrix<float,_4,_3>::Matrix(__return_storage_ptr__);
  tcu::Matrix<float,_4,_3>::setColumn(__return_storage_ptr__,0,(Vector<float,_4> *)(this + 0x30));
  tcu::Matrix<float,_4,_3>::setColumn(__return_storage_ptr__,1,(Vector<float,_4> *)(this + 0x40));
  tcu::Matrix<float,_4,_3>::setColumn(__return_storage_ptr__,2,(Vector<float,_4> *)(this + 0x50));
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat3x4 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT3X4> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat3x4 m;
	m.setColumn(0, evalCtx.in[0]);
	m.setColumn(1, evalCtx.in[1]);
	m.setColumn(2, evalCtx.in[2]);
	return m;
}